

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.h
# Opt level: O0

void __thiscall absl::lts_20250127::status_internal::StatusRep::Ref(StatusRep *this)

{
  StatusRep *this_local;
  
  LOCK();
  (this->ref_).super___atomic_base<int>._M_i = (this->ref_).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void Ref() const { ref_.fetch_add(1, std::memory_order_relaxed); }